

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_ncode(compiler_state_t *cstate,char *s,bpf_u_int32 v,qual q)

{
  int iVar1;
  block *pbVar2;
  block *b0;
  bpf_u_int32 mask;
  uint dir;
  char *fmt;
  uint type;
  byte bVar3;
  uint uVar4;
  uint proto;
  bpf_u_int32 v_local;
  
  uVar4 = (uint)q >> 8;
  proto = uVar4 & 0xff;
  v_local = v;
  if (s == (char *)0x0) {
    iVar1 = 0;
  }
  else if (proto == 0xc) {
    iVar1 = __pcap_atodn(s,&v_local);
    if (iVar1 == 0) {
      bpf_error(cstate,"malformed decnet address \'%s\'",s);
    }
  }
  else {
    iVar1 = __pcap_atoin(s,&v_local);
  }
  type = (uint)q & 0xff;
  if (q.addr < 8) {
    dir = (uint)q >> 0x10 & 0xff;
    bVar3 = q.proto;
    switch(type) {
    default:
      if (bVar3 == 0xc) {
        pbVar2 = gen_dnhostop(cstate,v_local,dir);
        return pbVar2;
      }
      if ((uVar4 & 0xff) != 1) {
        if (type == 2 && s == (char *)0x0) {
          mask = 0xffffffff;
          for (; v_local - 1 < 0xffffff; v_local = v_local << 8) {
            mask = mask << 8;
          }
        }
        else {
          v_local = v_local << (-(char)iVar1 & 0x1fU);
          mask = -1 << (-(char)iVar1 & 0x1fU);
        }
        pbVar2 = gen_host(cstate,v_local,mask,proto,dir,type);
        return pbVar2;
      }
      goto LAB_0010dc54;
    case 3:
      if ((bVar3 < 8) && ((0xe1U >> (uVar4 & 0x1f) & 1) != 0)) {
        if (0xffff < v_local) {
LAB_0010dc32:
          bpf_error(cstate,"illegal port number %u > 65535");
        }
        iVar1 = *(int *)(&DAT_0011f914 + (ulong)(uVar4 & 7) * 4);
        pbVar2 = gen_port(cstate,v_local,iVar1,dir);
        b0 = gen_port6(cstate,v_local,iVar1,dir);
LAB_0010dbdd:
        gen_or(b0,pbVar2);
        return pbVar2;
      }
      fmt = "illegal qualifier of \'port\'";
      break;
    case 4:
      fmt = "\'gateway\' requires a name";
      break;
    case 5:
      pbVar2 = gen_proto(cstate,v_local,proto,dir);
      return pbVar2;
    case 6:
      pbVar2 = gen_protochain(cstate,v_local,proto,0x11dc44);
      return pbVar2;
    case 7:
      if ((bVar3 < 8) && ((0xe1U >> (uVar4 & 0x1f) & 1) != 0)) {
        if (0xffff < v_local) goto LAB_0010dc32;
        iVar1 = *(int *)(&DAT_0011f914 + (ulong)(uVar4 & 7) * 4);
        pbVar2 = gen_portrange(cstate,v_local,v_local,iVar1,dir);
        b0 = gen_portrange6(cstate,v_local,v_local,iVar1,dir);
        goto LAB_0010dbdd;
      }
      fmt = "illegal qualifier of \'portrange\'";
    }
  }
  else {
    if (type != 0xff) {
      abort();
    }
    syntax(cstate);
LAB_0010dc54:
    fmt = "illegal link layer address";
  }
  bpf_error(cstate,fmt);
}

Assistant:

struct block *
gen_ncode(compiler_state_t *cstate, const char *s, bpf_u_int32 v, struct qual q)
{
	bpf_u_int32 mask;
	int proto = q.proto;
	int dir = q.dir;
	register int vlen;

	if (s == NULL)
		vlen = 32;
	else if (q.proto == Q_DECNET) {
		vlen = __pcap_atodn(s, &v);
		if (vlen == 0)
			bpf_error(cstate, "malformed decnet address '%s'", s);
	} else
		vlen = __pcap_atoin(s, &v);

	switch (q.addr) {

	case Q_DEFAULT:
	case Q_HOST:
	case Q_NET:
		if (proto == Q_DECNET)
			return gen_host(cstate, v, 0, proto, dir, q.addr);
		else if (proto == Q_LINK) {
			bpf_error(cstate, "illegal link layer address");
		} else {
			mask = 0xffffffff;
			if (s == NULL && q.addr == Q_NET) {
				/* Promote short net number */
				while (v && (v & 0xff000000) == 0) {
					v <<= 8;
					mask <<= 8;
				}
			} else {
				/* Promote short ipaddr */
				v <<= 32 - vlen;
				mask <<= 32 - vlen ;
			}
			return gen_host(cstate, v, mask, proto, dir, q.addr);
		}

	case Q_PORT:
		if (proto == Q_UDP)
			proto = IPPROTO_UDP;
		else if (proto == Q_TCP)
			proto = IPPROTO_TCP;
		else if (proto == Q_SCTP)
			proto = IPPROTO_SCTP;
		else if (proto == Q_DEFAULT)
			proto = PROTO_UNDEF;
		else
			bpf_error(cstate, "illegal qualifier of 'port'");

		if (v > 65535)
			bpf_error(cstate, "illegal port number %u > 65535", v);

	    {
		struct block *b;
		b = gen_port(cstate, (int)v, proto, dir);
		gen_or(gen_port6(cstate, (int)v, proto, dir), b);
		return b;
	    }

	case Q_PORTRANGE:
		if (proto == Q_UDP)
			proto = IPPROTO_UDP;
		else if (proto == Q_TCP)
			proto = IPPROTO_TCP;
		else if (proto == Q_SCTP)
			proto = IPPROTO_SCTP;
		else if (proto == Q_DEFAULT)
			proto = PROTO_UNDEF;
		else
			bpf_error(cstate, "illegal qualifier of 'portrange'");

		if (v > 65535)
			bpf_error(cstate, "illegal port number %u > 65535", v);

	    {
		struct block *b;
		b = gen_portrange(cstate, (int)v, (int)v, proto, dir);
		gen_or(gen_portrange6(cstate, (int)v, (int)v, proto, dir), b);
		return b;
	    }

	case Q_GATEWAY:
		bpf_error(cstate, "'gateway' requires a name");
		/* NOTREACHED */

	case Q_PROTO:
		return gen_proto(cstate, (int)v, proto, dir);

	case Q_PROTOCHAIN:
		return gen_protochain(cstate, (int)v, proto, dir);

	case Q_UNDEF:
		syntax(cstate);
		/* NOTREACHED */

	default:
		abort();
		/* NOTREACHED */
	}
	/* NOTREACHED */
}